

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void stressing_single_thread(void)

{
  ostream *this;
  LogStream *this_00;
  Logger local_fe8;
  int local_c;
  int i;
  
  this = std::operator<<((ostream *)&std::cout,"----------stressing test single thread-----------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    Logger::Logger(&local_fe8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/base/tests/LoggingTest.cpp"
                   ,0x2c);
    this_00 = Logger::stream(&local_fe8);
    LogStream::operator<<(this_00,local_c);
    Logger::~Logger(&local_fe8);
  }
  return;
}

Assistant:

void stressing_single_thread()
{
    // 100000 lines
    cout << "----------stressing test single thread-----------" << endl;
    for (int i = 0; i < 100000; ++i)
    {
        LOG << i;
    }
}